

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffpxsz(int datatype)

{
  int datatype_local;
  undefined4 local_4;
  
  if (datatype == 0xb) {
    local_4 = 1;
  }
  else if (datatype == 0x14) {
    local_4 = 2;
  }
  else if (datatype == 0x15) {
    local_4 = 2;
  }
  else if (datatype == 0x28) {
    local_4 = 8;
  }
  else if (datatype == 0x29) {
    local_4 = 8;
  }
  else if (datatype == 0x1f) {
    local_4 = 4;
  }
  else if (datatype == 0x1e) {
    local_4 = 4;
  }
  else if (datatype == 0x2a) {
    local_4 = 4;
  }
  else if (datatype == 0x52) {
    local_4 = 8;
  }
  else if (datatype == 0xe) {
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ffpxsz(int datatype)
/*
   return the number of bytes per pixel associated with the datatype
*/
{
    if (datatype == TBYTE)
       return(sizeof(char));
    else if (datatype == TUSHORT)
       return(sizeof(short));
    else if (datatype == TSHORT)
       return(sizeof(short));
    else if (datatype == TULONG)
       return(sizeof(long));
    else if (datatype == TLONG)
       return(sizeof(long));
    else if (datatype == TINT)
       return(sizeof(int));
    else if (datatype == TUINT)
       return(sizeof(int));
    else if (datatype == TFLOAT)
       return(sizeof(float));
    else if (datatype == TDOUBLE)
       return(sizeof(double));
    else if (datatype == TLOGICAL)
       return(sizeof(char));
    else
       return(0);
}